

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct32_high16_stage3_avx2(__m256i *x)

{
  __m256i *in_stack_00000040;
  __m256i *in_stack_00000048;
  
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

static inline void idct32_high16_stage3_avx2(__m256i *x) {
  btf_16_adds_subs_avx2(&x[16], &x[17]);
  btf_16_adds_subs_avx2(&x[19], &x[18]);
  btf_16_adds_subs_avx2(&x[20], &x[21]);
  btf_16_adds_subs_avx2(&x[23], &x[22]);
  btf_16_adds_subs_avx2(&x[24], &x[25]);
  btf_16_adds_subs_avx2(&x[27], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[29]);
  btf_16_adds_subs_avx2(&x[31], &x[30]);
}